

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

void av1_ml_prune_rect_partition
               (AV1_COMP *cpi,MACROBLOCK *x,int64_t best_rd,int64_t none_rd,int64_t *split_rd,
               PartitionSearchState *part_state)

{
  buf_2d *ref;
  BLOCK_SIZE bsize;
  byte bVar1;
  BLOCK_SIZE bsize_00;
  _Bool _Var2;
  int i_2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  NN_CONFIG *pNVar7;
  long lVar8;
  int i_1;
  ulong uVar9;
  ExtPartController *ext_part_controller;
  BLOCK_SIZE bsize_01;
  float mi_col;
  float features [9];
  int split_variance [4];
  buf_2d buf;
  float probs [3];
  float afStack_29c8 [596];
  float raw_scores [3];
  int local_54 [2];
  
  bsize_01 = (BLOCK_SIZE)part_state;
  bsize = (part_state->part_blk_params).bsize;
  if (999999999 < best_rd || (ulong)bsize < 3) {
    return;
  }
  lVar5 = 1;
  if (1 < best_rd) {
    lVar5 = best_rd;
  }
  mi_col = 0.01;
  switch(bsize) {
  case BLOCK_16X16:
    pNVar7 = &av1_rect_partition_nnconfig_16;
    break;
  case BLOCK_16X32:
  case BLOCK_32X16:
  case BLOCK_32X64:
  case BLOCK_64X32:
  case BLOCK_64X128:
  case BLOCK_128X64:
    goto switchD_001d0834_caseD_7;
  case BLOCK_32X32:
    pNVar7 = &av1_rect_partition_nnconfig_32;
    mi_col = 0.004;
    break;
  case BLOCK_64X64:
    pNVar7 = &av1_rect_partition_nnconfig_64;
    goto LAB_001d0866;
  case BLOCK_128X128:
    pNVar7 = &av1_rect_partition_nnconfig_128;
LAB_001d0866:
    mi_col = 0.002;
    break;
  default:
    if (bsize != BLOCK_8X8) {
      return;
    }
    pNVar7 = &av1_rect_partition_nnconfig_8;
  }
  for (lVar8 = 0; lVar8 != 5; lVar8 = lVar8 + 1) {
    features[lVar8] = 1.0;
  }
  if (none_rd - 1U < 999999999) {
    features[0] = (float)none_rd / (float)lVar5;
  }
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    if (split_rd[lVar8] - 1U < 999999999) {
      features[lVar8 + 1] = (float)split_rd[lVar8] / (float)lVar5;
    }
  }
  ref = &x->plane[0].src;
  uVar3 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,ref,bsize,0);
  bsize_00 = get_partition_subsize(bsize,'\x03');
  buf.stride = x->plane[0].src.stride;
  bVar1 = block_size_wide[bsize];
  for (uVar9 = 0; uVar9 != 4; uVar9 = uVar9 + 1) {
    uVar6 = 0;
    if ((uVar9 & 1) != 0) {
      uVar6 = (ulong)(bVar1 >> 1);
    }
    buf.buf = ref->buf +
              (ulong)(((uint)(uVar9 >> 1) & 0x7fffffff) * (uint)bVar1 >> 1) * (long)buf.stride +
              uVar6;
    uVar4 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,&buf,bsize_00,0);
    split_variance[uVar9] = uVar4;
  }
  uVar4 = 1;
  if (1 < (int)uVar3) {
    uVar4 = uVar3;
  }
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    features[lVar5 + 5] = (float)split_variance[lVar5] / (float)(int)uVar4;
  }
  write_features_to_file
            ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,features,9,5,
             bsize_01,(int)pNVar7,(int)mi_col);
  if ((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
     (ext_part_controller = &cpi->ext_part_controller, ext_part_controller->ready != 0)) {
    probs[0] = 7.00649e-45;
    for (lVar5 = 0; lVar5 != 9; lVar5 = lVar5 + 1) {
      afStack_29c8[lVar5] = features[lVar5];
    }
    av1_ext_part_send_features(ext_part_controller,(aom_partition_features_t *)probs);
    _Var2 = av1_ext_part_get_partition_decision
                      (ext_part_controller,(aom_partition_decision_t *)raw_scores);
    if (_Var2) {
      *&part_state->prune_rect_part = local_54;
      return;
    }
  }
  raw_scores[2] = 0.0;
  raw_scores[0] = 0.0;
  raw_scores[1] = 0.0;
  (*av1_nn_predict)(features,pNVar7,1,raw_scores);
  probs[2] = 0.0;
  probs[0] = 0.0;
  probs[1] = 0.0;
  av1_nn_softmax(raw_scores,probs,3);
  if (probs[1] <= mi_col) {
    part_state->prune_rect_part[0] = 1;
  }
  if (probs[2] <= mi_col) {
    part_state->prune_rect_part[1] = 1;
  }
switchD_001d0834_caseD_7:
  return;
}

Assistant:

void av1_ml_prune_rect_partition(AV1_COMP *const cpi, const MACROBLOCK *const x,
                                 int64_t best_rd, int64_t none_rd,
                                 const int64_t *split_rd,
                                 PartitionSearchState *part_state) {
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const int mi_row = blk_params->mi_row, mi_col = blk_params->mi_col;
  const BLOCK_SIZE bsize = blk_params->bsize;

  if (bsize < BLOCK_8X8 || best_rd >= 1000000000) return;
  best_rd = AOMMAX(best_rd, 1);
  const NN_CONFIG *nn_config = NULL;
  const float prob_thresholds[5] = { 0.01f, 0.01f, 0.004f, 0.002f, 0.002f };
  float cur_thresh = 0.0f;
  switch (bsize) {
    case BLOCK_8X8:
      nn_config = &av1_rect_partition_nnconfig_8;
      cur_thresh = prob_thresholds[0];
      break;
    case BLOCK_16X16:
      nn_config = &av1_rect_partition_nnconfig_16;
      cur_thresh = prob_thresholds[1];
      break;
    case BLOCK_32X32:
      nn_config = &av1_rect_partition_nnconfig_32;
      cur_thresh = prob_thresholds[2];
      break;
    case BLOCK_64X64:
      nn_config = &av1_rect_partition_nnconfig_64;
      cur_thresh = prob_thresholds[3];
      break;
    case BLOCK_128X128:
      nn_config = &av1_rect_partition_nnconfig_128;
      cur_thresh = prob_thresholds[4];
      break;
    default: assert(0 && "Unexpected bsize.");
  }
  if (!nn_config) return;

  // 1. Compute input features
  float features[9];

  // RD cost ratios
  for (int i = 0; i < 5; i++) features[i] = 1.0f;
  if (none_rd > 0 && none_rd < 1000000000)
    features[0] = (float)none_rd / (float)best_rd;
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
    if (split_rd[i] > 0 && split_rd[i] < 1000000000)
      features[1 + i] = (float)split_rd[i] / (float)best_rd;
  }

  // Variance ratios
  const MACROBLOCKD *const xd = &x->e_mbd;
  int whole_block_variance;
  whole_block_variance = av1_get_perpixel_variance_facade(
      cpi, xd, &x->plane[0].src, bsize, AOM_PLANE_Y);
  whole_block_variance = AOMMAX(whole_block_variance, 1);

  int split_variance[SUB_PARTITIONS_SPLIT];
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
  struct buf_2d buf;
  buf.stride = x->plane[0].src.stride;
  const int bw = block_size_wide[bsize];
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    const int x_idx = (i & 1) * bw / 2;
    const int y_idx = (i >> 1) * bw / 2;
    buf.buf = x->plane[0].src.buf + x_idx + y_idx * buf.stride;
    split_variance[i] =
        av1_get_perpixel_variance_facade(cpi, xd, &buf, subsize, AOM_PLANE_Y);
  }

  for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++)
    features[5 + i] = (float)split_variance[i] / (float)whole_block_variance;

  // Write features to file
  write_features_to_file(cpi->oxcf.partition_info_path,
                         cpi->ext_part_controller.test_mode, features,
                         /*feature_size=*/9, 5, bsize, mi_row, mi_col);

  if (ext_ml_model_decision_after_split_part2(
          &cpi->ext_part_controller, frame_is_intra_only(&cpi->common),
          features, &part_state->prune_rect_part[HORZ],
          &part_state->prune_rect_part[VERT])) {
    return;
  }

  // 2. Do the prediction and prune 0-2 partitions based on their probabilities
  float raw_scores[3] = { 0.0f };
  av1_nn_predict(features, nn_config, 1, raw_scores);
  float probs[3] = { 0.0f };
  av1_nn_softmax(raw_scores, probs, 3);

  // probs[0] is the probability of the fact that both rectangular partitions
  // are worse than current best_rd
  if (probs[1] <= cur_thresh) part_state->prune_rect_part[HORZ] = 1;
  if (probs[2] <= cur_thresh) part_state->prune_rect_part[VERT] = 1;
}